

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::
node_tmp<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>_>
::~node_tmp(node_tmp<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>_>
            *this)

{
  if (this->node_ != (node_pointer)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>
             *)&this->node_->value_base_);
    operator_delete(this->node_);
    return;
  }
  return;
}

Assistant:

node_tmp<Alloc>::~node_tmp()
    {
        if (node_) {
            boost::unordered::detail::func::call_destroy(alloc_,
                node_->value_ptr());
            boost::unordered::detail::func::destroy(
                boost::addressof(*node_));
            node_allocator_traits::deallocate(alloc_, node_, 1);
        }
    }